

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int addk(FuncState *fs,TValue *k,TValue *v)

{
  lua_State *L;
  Proto *pPVar1;
  global_State *g;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  TValue *i_o;
  TValue *pTVar6;
  long lVar7;
  long lVar8;
  int *piVar9;
  ulong uVar10;
  TValue *o2;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  L = fs->L;
  pTVar6 = luaH_set(L,fs->h,k);
  if (pTVar6->tt == 3) {
    iVar5 = (int)(pTVar6->value).n;
  }
  else {
    pPVar1 = fs->f;
    iVar5 = pPVar1->sizek;
    (pTVar6->value).n = (double)fs->nk;
    pTVar6->tt = 3;
    iVar14 = pPVar1->sizek;
    if (iVar14 <= fs->nk) {
      pTVar6 = (TValue *)
               luaM_growaux_(L,pPVar1->k,&pPVar1->sizek,0x10,0x3ffff,"constant table overflow");
      pPVar1->k = pTVar6;
      iVar14 = pPVar1->sizek;
    }
    auVar4 = _DAT_00115030;
    auVar3 = _DAT_00115020;
    auVar2 = _DAT_00115010;
    pTVar6 = pPVar1->k;
    if (iVar5 < iVar14) {
      lVar7 = (long)iVar14 - (long)iVar5;
      lVar8 = lVar7 + -1;
      auVar11._8_4_ = (int)lVar8;
      auVar11._0_8_ = lVar8;
      auVar11._12_4_ = (int)((ulong)lVar8 >> 0x20);
      piVar9 = &pTVar6[(long)iVar5 + 3].tt;
      uVar10 = 0;
      auVar11 = auVar11 ^ _DAT_00115030;
      do {
        auVar12._8_4_ = (int)uVar10;
        auVar12._0_8_ = uVar10;
        auVar12._12_4_ = (int)(uVar10 >> 0x20);
        auVar13 = (auVar12 | auVar3) ^ auVar4;
        iVar5 = auVar11._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar5 && auVar11._0_4_ < auVar13._0_4_ ||
                    iVar5 < auVar13._4_4_) & 1)) {
          piVar9[-0xc] = 0;
        }
        if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
            auVar13._12_4_ <= auVar11._12_4_) {
          piVar9[-8] = 0;
        }
        auVar12 = (auVar12 | auVar2) ^ auVar4;
        iVar14 = auVar12._4_4_;
        if (iVar14 <= iVar5 && (iVar14 != iVar5 || auVar12._0_4_ <= auVar11._0_4_)) {
          piVar9[-4] = 0;
          *piVar9 = 0;
        }
        uVar10 = uVar10 + 4;
        piVar9 = piVar9 + 0x10;
      } while ((lVar7 + 3U & 0xfffffffffffffffc) != uVar10);
    }
    iVar5 = fs->nk;
    pTVar6[iVar5].value = v->value;
    iVar14 = v->tt;
    pTVar6[iVar5].tt = iVar14;
    if (((3 < iVar14) && (((((v->value).gc)->gch).marked & 3) != 0)) && ((pPVar1->marked & 4) != 0))
    {
      g = L->l_G;
      if (g->gcstate == '\x01') {
        reallymarkobject(g,(v->value).gc);
      }
      else {
        pPVar1->marked = g->currentwhite & 3 | pPVar1->marked & 0xf8;
      }
    }
    iVar5 = fs->nk;
    fs->nk = iVar5 + 1;
  }
  return iVar5;
}

Assistant:

static int addk(FuncState*fs,TValue*k,TValue*v){
lua_State*L=fs->L;
TValue*idx=luaH_set(L,fs->h,k);
Proto*f=fs->f;
int oldsize=f->sizek;
if(ttisnumber(idx)){
return cast_int(nvalue(idx));
}
else{
setnvalue(idx,cast_num(fs->nk));
luaM_growvector(L,f->k,fs->nk,f->sizek,TValue,
((1<<(9+9))-1),"constant table overflow");
while(oldsize<f->sizek)setnilvalue(&f->k[oldsize++]);
setobj(L,&f->k[fs->nk],v);
luaC_barrier(L,f,v);
return fs->nk++;
}
}